

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O0

void TTD::NSLogEvents::
     JsRTVarAndIntegralArgumentsAction_InternalUse_Parse<(TTD::NSLogEvents::EventKind)56,2ul,1ul>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  bool bVar1;
  int iVar2;
  JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_1UL> *pJVar3;
  TTDVar pvVar4;
  FileReader *reader_00;
  undefined4 extraout_var;
  FileReader *reader_01;
  FileReader *extraout_RDX;
  size_t i_1;
  size_t i;
  JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_1UL> *vAction;
  UnlinkableSlabAllocator *alloc_local;
  FileReader *reader_local;
  ThreadContext *threadContext_local;
  EventLogEntry *evt_local;
  
  pJVar3 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<2ul,1ul>,(TTD::NSLogEvents::EventKind)56>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar4 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_01);
  pJVar3->Result = pvVar4;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  reader_00 = extraout_RDX;
  for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
    reader_00 = (FileReader *)
                NSSnapValues::ParseTTDVar
                          ((NSSnapValues *)(ulong)(i_1 != 0),SUB81(reader,0),reader_00);
    pJVar3->VarArray[i_1] = reader_00;
  }
  bVar1 = false;
  while (!bVar1) {
    iVar2 = (*reader->_vptr_FileReader[0xd])(reader,1);
    pJVar3->ScalarArray[0] = CONCAT44(extraout_var,iVar2);
    bVar1 = true;
  }
  (*reader->_vptr_FileReader[5])();
  return;
}

Assistant:

void JsRTVarAndIntegralArgumentsAction_InternalUse_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>* vAction = GetInlineEventDataAs<JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            vAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            reader->ReadSequenceStart_WDefaultKey(true);
            for(size_t i = 0; i < vcount; ++i)
            {
                vAction->VarArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
            }

            for(size_t i = 0; i < icount; ++i)
            {
                vAction->ScalarArray[i] = reader->ReadNakedInt64(vcount + i != 0);
            }
            reader->ReadSequenceEnd();
        }